

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakeit.hpp
# Opt level: O1

void __thiscall
fakeit::RecordedMethodBody<unsigned_long>::MatchedInvocationHandler::MatchedInvocationHandler
          (MatchedInvocationHandler *this,Matcher *matcher,
          ActualInvocationHandler<unsigned_long> *invocationHandler)

{
  element_type *peVar1;
  
  (this->super_ActualInvocationHandler<unsigned_long>).super_Destructible._vptr_Destructible =
       (_func_int **)&PTR__MatchedInvocationHandler_0012f808;
  if (matcher == (Matcher *)0x0) {
    peVar1 = (element_type *)0x0;
  }
  else {
    peVar1 = (element_type *)(&matcher->field_0x0 + *(long *)((long)*matcher + -0x20));
  }
  (this->_matcher).super___shared_ptr<fakeit::Destructible,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<fakeit::ActualInvocation<>::Matcher*>
            (&(this->_matcher).super___shared_ptr<fakeit::Destructible,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,matcher);
  (this->_invocationHandler).super___shared_ptr<fakeit::Destructible,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = &invocationHandler->super_Destructible;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<fakeit::ActualInvocationHandler<unsigned_long>*>
            (&(this->_invocationHandler).
              super___shared_ptr<fakeit::Destructible,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             invocationHandler);
  return;
}

Assistant:

MatchedInvocationHandler(typename ActualInvocation<arglist...>::Matcher *matcher,
                ActualInvocationHandler<R, arglist...> *invocationHandler) :
                    _matcher{matcher}, _invocationHandler{invocationHandler} {
            }